

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_builder.c
# Opt level: O1

TableCells * get_table_cells(Token_conflict *token)

{
  wchar_t wVar1;
  Span *pSVar2;
  TableCells *pTVar3;
  TableCell *to_table_cell;
  TableCell *from_table_cell;
  long lVar4;
  Location_conflict location;
  long lVar5;
  
  pTVar3 = (TableCells *)malloc(0x10);
  wVar1 = token->matched_items->count;
  lVar5 = (long)wVar1;
  pTVar3->cell_count = wVar1;
  pTVar3->table_cells = (TableCell *)0x0;
  if (0 < lVar5) {
    to_table_cell = (TableCell *)malloc(lVar5 << 5);
    pTVar3->table_cells = to_table_cell;
    wVar1 = (token->location).line;
    lVar4 = 0;
    do {
      pSVar2 = token->matched_items->items;
      location.column = *(int *)((long)&pSVar2->column + lVar4);
      location.line = wVar1;
      from_table_cell = TableCell_new(location,*(wchar_t **)((long)&pSVar2->text + lVar4));
      TableCell_transfer(to_table_cell,from_table_cell);
      to_table_cell = to_table_cell + 1;
      lVar4 = lVar4 + 0x10;
    } while (lVar5 * 0x10 != lVar4);
  }
  return pTVar3;
}

Assistant:

static const TableCells* get_table_cells(Token* token) {
    TableCells* table_cells = (TableCells*)malloc(sizeof(TableCells));
    table_cells->cell_count = token->matched_items->count;
    table_cells->table_cells = 0;
    if (table_cells->cell_count > 0) {
        table_cells->table_cells = (TableCell*)malloc(table_cells->cell_count * sizeof(TableCell));
        Location location;
        location.line = token->location.line;
        int i;
        for (i = 0; i < table_cells->cell_count; ++i) {
            location.column = token->matched_items->items[i].column;
            TableCell_transfer(&table_cells->table_cells[i], (TableCell*)TableCell_new(location, token->matched_items->items[i].text));
        }
    }
    return table_cells;
}